

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiverImpl.cpp
# Opt level: O3

Bool __thiscall
Diligent::ArchiverImpl::SerializeToStream
          (ArchiverImpl *this,Uint32 ContentVersion,IFileStream *pStream)

{
  Bool BVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 uVar4;
  RefCntAutoPtr<Diligent::IDataBlob> pDataBlob;
  string msg;
  RefCntAutoPtr<Diligent::IDataBlob> local_40;
  string local_38;
  
  if (pStream == (IFileStream *)0x0) {
    FormatString<char[25]>(&local_38,(char (*) [25])"pStream must not be null");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"SerializeToStream",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverImpl.cpp"
               ,0xf6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    uVar4 = 0;
  }
  else {
    local_38._M_string_length = (size_type)&local_40;
    local_40.m_pObject = (IDataBlob *)0x0;
    local_38._M_dataplus._M_p = (pointer)0x0;
    BVar1 = SerializeToBlob(this,ContentVersion,(IDataBlob **)&local_38);
    RefCntAutoPtr<Diligent::IDataBlob>::DoublePtrHelper<Diligent::IDataBlob>::~DoublePtrHelper
              ((DoublePtrHelper<Diligent::IDataBlob> *)&local_38);
    if (BVar1) {
      iVar2 = (*((local_40.m_pObject)->super_IObject)._vptr_IObject[7])(local_40.m_pObject,0);
      iVar3 = (*((local_40.m_pObject)->super_IObject)._vptr_IObject[5])();
      iVar2 = (*(pStream->super_IObject)._vptr_IObject[6])
                        (pStream,CONCAT44(extraout_var,iVar2),CONCAT44(extraout_var_00,iVar3));
      uVar4 = (undefined1)iVar2;
    }
    else {
      uVar4 = 0;
    }
    if (local_40.m_pObject != (IDataBlob *)0x0) {
      (*((local_40.m_pObject)->super_IObject)._vptr_IObject[2])();
    }
  }
  return (Bool)uVar4;
}

Assistant:

Bool ArchiverImpl::SerializeToStream(Uint32 ContentVersion, IFileStream* pStream)
{
    DEV_CHECK_ERR(pStream != nullptr, "pStream must not be null");
    if (pStream == nullptr)
        return false;

    RefCntAutoPtr<IDataBlob> pDataBlob;
    if (!SerializeToBlob(ContentVersion, &pDataBlob))
        return false;

    return pStream->Write(pDataBlob->GetConstDataPtr(), pDataBlob->GetSize());
}